

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

void serial_try_write(Serial *serial)

{
  bufchain *ch;
  Seat *pSVar1;
  size_t sVar2;
  int *piVar3;
  ptrlen pVar4;
  
  if (serial->fd < 0) {
    __assert_fail("serial->fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/serial.c",
                  0x1b7,"void serial_try_write(Serial *)");
  }
  ch = &serial->output_data;
  do {
    sVar2 = bufchain_size(ch);
    if (sVar2 == 0) {
LAB_0013a373:
      pSVar1 = serial->seat;
      sVar2 = bufchain_size(ch);
      (*pSVar1->vt->sent)(pSVar1,sVar2);
      serial_uxsel_setup(serial);
      return;
    }
    pVar4 = bufchain_prefix(ch);
    sVar2 = write(serial->fd,pVar4.ptr,pVar4.len);
    if ((long)sVar2 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        perror("write serial port");
        exit(1);
      }
      goto LAB_0013a373;
    }
    bufchain_consume(ch,sVar2);
  } while( true );
}

Assistant:

static void serial_try_write(Serial *serial)
{
    ssize_t ret;

    assert(serial->fd >= 0);

    while (bufchain_size(&serial->output_data) > 0) {
        ptrlen data = bufchain_prefix(&serial->output_data);
        ret = write(serial->fd, data.ptr, data.len);

        if (ret < 0 && (errno == EWOULDBLOCK)) {
            /*
             * We've sent all we can for the moment.
             */
            break;
        }
        if (ret < 0) {
            perror("write serial port");
            exit(1);
        }
        bufchain_consume(&serial->output_data, ret);
    }

    seat_sent(serial->seat, bufchain_size(&serial->output_data));
    serial_uxsel_setup(serial);
}